

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

fb_symbol_t * lookup_reference(fb_parser_t *P,fb_scope_t *local,fb_ref_t *name,fb_ref_t **enumval)

{
  fb_symbol_t *sym_00;
  fb_compound_type_t *pfVar1;
  fb_scope_t *pfVar2;
  int local_5c;
  int count;
  fb_symbol_t *sym;
  fb_scope_t *scope;
  fb_ref_t *p;
  fb_ref_t *last;
  fb_ref_t *basename;
  fb_ref_t **enumval_local;
  fb_ref_t *name_local;
  fb_scope_t *local_local;
  fb_parser_t *P_local;
  
  local_5c = 0;
  p = (fb_ref_t *)0x0;
  last = (fb_ref_t *)0x0;
  for (scope = (fb_scope_t *)name; scope != (fb_scope_t *)0x0; scope = (fb_scope_t *)scope->name) {
    last = p;
    p = (fb_ref_t *)scope;
    local_5c = local_5c + 1;
  }
  if (enumval == (fb_ref_t **)0x0) {
    last = p;
  }
  else {
    local_5c = local_5c + -1;
    *enumval = p;
  }
  if (last == (fb_ref_t *)0x0) {
    P_local = (fb_parser_t *)0x0;
  }
  else if ((local == (fb_scope_t *)0x0) || (name_local = (fb_ref_t *)local, local_5c != 1)) {
    enumval_local = &name->link;
    if (local_5c == 1) {
      enumval_local = (fb_ref_t **)0x0;
    }
    pfVar2 = fb_find_scope_by_ref(&P->schema,(fb_ref_t *)enumval_local,local_5c + -1);
    if (pfVar2 == (fb_scope_t *)0x0) {
      P_local = (fb_parser_t *)0x0;
    }
    else {
      P_local = (fb_parser_t *)find_fb_symbol_by_token(&pfVar2->symbol_index,last->ident);
      if ((P_local == (fb_parser_t *)0x0) ||
         (pfVar1 = get_compound_if_visible(&P->schema,(fb_symbol_t *)P_local),
         pfVar1 == (fb_compound_type_t *)0x0)) {
        P_local = (fb_parser_t *)0x0;
      }
    }
  }
  else {
    do {
      sym_00 = find_fb_symbol_by_token((fb_symbol_table_t *)&name_local->ident,last->ident);
      if ((sym_00 != (fb_symbol_t *)0x0) &&
         (pfVar1 = get_compound_if_visible(&P->schema,sym_00), pfVar1 != (fb_compound_type_t *)0x0))
      {
        return sym_00;
      }
      name_local = (fb_ref_t *)find_parent_scope(P,(fb_scope_t *)name_local);
    } while ((fb_scope_t *)name_local != (fb_scope_t *)0x0);
    P_local = (fb_parser_t *)0x0;
  }
  return (fb_symbol_t *)P_local;
}

Assistant:

static inline fb_symbol_t *lookup_reference(fb_parser_t *P, fb_scope_t *local, fb_ref_t *name, fb_ref_t **enumval)
{
    fb_ref_t *basename, *last, *p;
    fb_scope_t *scope;
    fb_symbol_t *sym;
    int count;

    count = 0;
    scope = 0;
    p = name;
    last = 0;
    basename = 0;
    while (p) {
        basename = last;
        last = p;
        p = p->link;
        ++count;
    }
    if (enumval) {
        --count;
        *enumval = last;
    } else {
        basename = last;
    }
    if (!basename) {
        return 0;
    }
    if (local && count == 1) {
        do {
            if ((sym = find_fb_symbol_by_token(&local->symbol_index, basename->ident))) {
                if (get_compound_if_visible(&P->schema, sym)) {
                    return sym;
                }
            }
            local = find_parent_scope(P, local);
        } while (local);
        return 0;
    }
    /* Null name is valid in scope lookup, indicating global scope. */
    if (count == 1) {
        name = 0;
    }
    if (!(scope = fb_find_scope_by_ref(&P->schema, name, count - 1))) {
        return 0;
    }
    sym = find_fb_symbol_by_token(&scope->symbol_index, basename->ident);
    if (sym && get_compound_if_visible(&P->schema, sym)) {
        return sym;
    }
    return 0;
}